

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

matrix sptk::swipe::im2m(intmatrix yr_matrix)

{
  long in_RSI;
  undefined8 in_RDI;
  matrix mVar1;
  int j;
  int i;
  matrix nw_matrix;
  int local_28;
  int local_24;
  double **local_8;
  
  mVar1 = makem((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  for (local_24 = 0; local_24 < (int)in_RDI; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < (int)((ulong)in_RDI >> 0x20); local_28 = local_28 + 1) {
      local_8 = mVar1.m;
      local_8[local_24][local_28] =
           (double)*(int *)(*(long *)(in_RSI + (long)local_24 * 8) + (long)local_28 * 4);
    }
  }
  return mVar1;
}

Assistant:

matrix im2m(intmatrix yr_matrix) {
    matrix nw_matrix = makem(yr_matrix.x, yr_matrix.y);
    int i, j;
    for (i = 0; i < yr_matrix.x; i++)
        for (j = 0; j < yr_matrix.y; j++)
            nw_matrix.m[i][j] = yr_matrix.m[i][j];
    return(nw_matrix);
}